

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::MonthNameFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc8c;
  FunctionNullHandling in_stack_fffffffffffffc98;
  bind_lambda_function_t in_stack_fffffffffffffca0;
  LogicalType local_358;
  scalar_function_t local_340;
  scalar_function_t local_320;
  LogicalType local_300;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e8;
  LogicalType local_2d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b8;
  LogicalType local_2a0;
  LogicalType local_288;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_358,DATE);
  __l._M_len = 1;
  __l._M_array = &local_358;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2b8,__l,(allocator_type *)&stack0xfffffffffffffca7);
  LogicalType::LogicalType(&local_2d0,VARCHAR);
  local_320.super__Function_base._M_functor._8_8_ = 0;
  local_320.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::date_t,duckdb::string_t,duckdb::MonthNameOperator>;
  local_320._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_320.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_288,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_288;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc84;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc8c;
  ScalarFunction::ScalarFunction
            (&local_148,(vector<duckdb::LogicalType,_true> *)&local_2b8,&local_2d0,&local_320,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffca0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  LogicalType::~LogicalType(&local_288);
  ::std::_Function_base::~_Function_base(&local_320.super__Function_base);
  LogicalType::~LogicalType(&local_2d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b8);
  LogicalType::~LogicalType(&local_358);
  LogicalType::LogicalType(&local_358,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = &local_358;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e8,__l_00,(allocator_type *)&stack0xfffffffffffffca7);
  LogicalType::LogicalType(&local_300,VARCHAR);
  local_340.super__Function_base._M_functor._8_8_ = 0;
  local_340.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::timestamp_t,duckdb::string_t,duckdb::MonthNameOperator>;
  local_340._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_340.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2a0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_2a0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffc84;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffc8c;
  ScalarFunction::ScalarFunction
            (&local_270,(vector<duckdb::LogicalType,_true> *)&local_2e8,&local_300,&local_340,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffca0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  LogicalType::~LogicalType(&local_2a0);
  ::std::_Function_base::~_Function_base(&local_340.super__Function_base);
  LogicalType::~LogicalType(&local_300);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e8);
  LogicalType::~LogicalType(&local_358);
  return in_RDI;
}

Assistant:

ScalarFunctionSet MonthNameFun::GetFunctions() {
	ScalarFunctionSet monthname;
	monthname.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::VARCHAR,
	                                     DatePart::UnaryFunction<date_t, string_t, MonthNameOperator>));
	monthname.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::VARCHAR,
	                                     DatePart::UnaryFunction<timestamp_t, string_t, MonthNameOperator>));
	return monthname;
}